

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O2

lzma_ret lzma_lz_decoder_init
                   (lzma_next_coder_conflict4 *next,lzma_allocator *allocator,
                   lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  lzma_ret lVar1;
  lzma_coder_conflict5 *plVar2;
  uint8_t *ptr;
  size_t sVar3;
  lzma_lz_options lz_options;
  
  plVar2 = next->coder;
  if (plVar2 == (lzma_coder_conflict5 *)0x0) {
    plVar2 = (lzma_coder_conflict5 *)lzma_alloc(0x10b0,allocator);
    next->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict5 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = lz_decode;
    next->end = lz_decoder_end;
    (plVar2->dict).buf = (uint8_t *)0x0;
    (plVar2->dict).size = 0;
    (plVar2->lz).coder = (lzma_coder_conflict5 *)0x0;
    (plVar2->lz).code =
         (_func_lzma_ret_lzma_coder_ptr_lzma_dict_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
    (plVar2->lz).reset = (_func_void_lzma_coder_ptr_void_ptr *)0x0;
    (plVar2->lz).set_uncompressed = (_func_void_lzma_coder_ptr_lzma_vli *)0x0;
    (plVar2->lz).end = (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict3 *)0x0;
    (plVar2->next).coder = (lzma_coder_conflict5 *)0x0;
    (plVar2->next).id = 0xffffffffffffffff;
    (plVar2->next).init = 0;
    (plVar2->next).code = (lzma_code_function_conflict3)0x0;
    (plVar2->next).end = (lzma_end_function_conflict3)0x0;
    (plVar2->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict4 *)0x0;
    (plVar2->next).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict4 *)0x0;
    (plVar2->next).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict4
          *)0x0;
  }
  lVar1 = (*lz_init)(&plVar2->lz,allocator,filters->options,&lz_options);
  if ((lVar1 == LZMA_OK) &&
     ((sVar3 = 0x1000, lz_options.dict_size < 0x1000 ||
      (sVar3 = lz_options.dict_size, lVar1 = LZMA_MEM_ERROR,
      lz_options.dict_size < 0xfffffffffffffff1)))) {
    lz_options.dict_size = sVar3 + 0xf & 0xfffffffffffffff0;
    plVar2 = next->coder;
    ptr = (plVar2->dict).buf;
    if ((plVar2->dict).size != lz_options.dict_size) {
      lzma_free(ptr,allocator);
      ptr = (uint8_t *)lzma_alloc(lz_options.dict_size,allocator);
      plVar2 = next->coder;
      (plVar2->dict).buf = ptr;
      if (ptr == (uint8_t *)0x0) {
        return LZMA_MEM_ERROR;
      }
      (plVar2->dict).size = lz_options.dict_size;
    }
    (plVar2->dict).pos = 0;
    (plVar2->dict).full = 0;
    ptr[lz_options.dict_size - 1] = '\0';
    (plVar2->dict).need_reset = false;
    plVar2 = next->coder;
    if (lz_options.preset_dict_size != 0 && lz_options.preset_dict != (uint8_t *)0x0) {
      sVar3 = lz_options.dict_size;
      if (lz_options.preset_dict_size < lz_options.dict_size) {
        sVar3 = lz_options.preset_dict_size;
      }
      memcpy((plVar2->dict).buf,lz_options.preset_dict + (lz_options.preset_dict_size - sVar3),sVar3
            );
      plVar2 = next->coder;
      (plVar2->dict).pos = sVar3;
      (plVar2->dict).full = sVar3;
    }
    plVar2->next_finished = false;
    plVar2->this_finished = false;
    (plVar2->temp).pos = 0;
    (plVar2->temp).size = 0;
    lVar1 = lzma_next_filter_init((lzma_next_coder *)&plVar2->next,allocator,filters + 1);
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_lz_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_decoder *lz,
			lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
	lzma_lz_options lz_options;

	// Allocate the base structure if it isn't already allocated.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &lz_decode;
		next->end = &lz_decoder_end;

		next->coder->dict.buf = NULL;
		next->coder->dict.size = 0;
		next->coder->lz = LZMA_LZ_DECODER_INIT;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Allocate and initialize the LZ-based decoder. It will also give
	// us the dictionary size.
	return_if_error(lz_init(&next->coder->lz, allocator,
			filters[0].options, &lz_options));

	// If the dictionary size is very small, increase it to 4096 bytes.
	// This is to prevent constant wrapping of the dictionary, which
	// would slow things down. The downside is that since we don't check
	// separately for the real dictionary size, we may happily accept
	// corrupt files.
	if (lz_options.dict_size < 4096)
		lz_options.dict_size = 4096;

	// Make dictionary size a multipe of 16. Some LZ-based decoders like
	// LZMA use the lowest bits lzma_dict.pos to know the alignment of the
	// data. Aligned buffer is also good when memcpying from the
	// dictionary to the output buffer, since applications are
	// recommended to give aligned buffers to liblzma.
	//
	// Avoid integer overflow.
	if (lz_options.dict_size > SIZE_MAX - 15)
		return LZMA_MEM_ERROR;

	lz_options.dict_size = (lz_options.dict_size + 15) & ~((size_t)(15));

	// Allocate and initialize the dictionary.
	if (next->coder->dict.size != lz_options.dict_size) {
		lzma_free(next->coder->dict.buf, allocator);
		next->coder->dict.buf
				= lzma_alloc(lz_options.dict_size, allocator);
		if (next->coder->dict.buf == NULL)
			return LZMA_MEM_ERROR;

		next->coder->dict.size = lz_options.dict_size;
	}

	lz_decoder_reset(next->coder);

	// Use the preset dictionary if it was given to us.
	if (lz_options.preset_dict != NULL
			&& lz_options.preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, copy only the tail.
		const size_t copy_size = my_min(lz_options.preset_dict_size,
				lz_options.dict_size);
		const size_t offset = lz_options.preset_dict_size - copy_size;
		memcpy(next->coder->dict.buf, lz_options.preset_dict + offset,
				copy_size);
		next->coder->dict.pos = copy_size;
		next->coder->dict.full = copy_size;
	}

	// Miscellaneous initializations
	next->coder->next_finished = false;
	next->coder->this_finished = false;
	next->coder->temp.pos = 0;
	next->coder->temp.size = 0;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&next->coder->next, allocator,
			filters + 1);
}